

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

iterator __thiscall
QList<QXmlStreamPrivateTagStack::NamespaceDeclaration>::end
          (QList<QXmlStreamPrivateTagStack::NamespaceDeclaration> *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,
               (QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)0x0);
  }
  return (iterator)((this->d).ptr + (this->d).size);
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }